

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

logical pnga_set_ghost_info(Integer g_a)

{
  logical lVar1;
  
  if (GA[g_a + 1000].cache != (double *)0x0) {
    free(GA[g_a + 1000].cache);
  }
  GA[g_a + 1000].cache = (double *)0x0;
  if (GA[g_a + 1000].actv == 1) {
    lVar1 = pnga_set_update4_info(g_a);
    return lVar1;
  }
  return 1;
}

Assistant:

logical pnga_set_ghost_info(Integer g_a)
{
  Integer handle = g_a + GA_OFFSET;
  if (GA[handle].cache != NULL)
    free(GA[handle].cache);
  GA[handle].cache = NULL;
  if (GA[handle].actv == 1) {
    return pnga_set_update4_info(g_a);
  }
  return TRUE;
}